

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::layout_for_member_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  ID *__k;
  uint uVar1;
  uint uVar2;
  Decoration *pDVar3;
  bool bVar4;
  mapped_type *pmVar5;
  CompilerError *this_00;
  ulong uVar6;
  uint *ts_1;
  allocator local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Bitset flags;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  
  bVar4 = is_legacy(this);
  if (bVar4) {
LAB_0022678b:
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&attr);
    return __return_storage_ptr__;
  }
  __k = &(type->super_IVariant).self;
  bVar4 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if ((!bVar4) &&
     (bVar4 = Compiler::has_decoration(&this->super_Compiler,(ID)__k->id,DecorationBufferBlock),
     !bVar4)) goto LAB_0022678b;
  pmVar5 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,__k);
  uVar6 = (ulong)index;
  if ((pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <= uVar6)
  goto LAB_0022678b;
  pDVar3 = (pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
  attr.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr.stack_storage;
  attr.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  attr.buffer_capacity = 8;
  bVar4 = Compiler::has_member_decoration
                    (&this->super_Compiler,(TypeID)__k->id,index,DecorationPassthroughNV);
  if (bVar4) {
    ::std::__cxx11::string::string((string *)&flags,"passthrough",(allocator *)&local_1a8);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
    ::std::__cxx11::string::~string((string *)&flags);
  }
  ts_1 = (uint *)(ulong)index;
  Compiler::combined_decoration_for_member(&flags,&this->super_Compiler,type,index);
  if (((byte)flags.lower & 0x10) != 0) {
    ::std::__cxx11::string::string((string *)&local_1a8,"row_major",&local_1a9);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
  }
  if (((pDVar3[uVar6].decoration_flags.lower & 0x40000000) != 0) &&
     (bVar4 = can_use_io_location(this,type->storage,true), bVar4)) {
    join<char_const(&)[12],unsigned_int&>
              (&local_1a8,(spirv_cross *)"location = ",(char (*) [12])&pDVar3[uVar6].location,ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
  }
  if (((pDVar3[uVar6].decoration_flags.lower & 0x80000000) != 0) &&
     (bVar4 = can_use_io_location(this,type->storage,true), bVar4)) {
    if ((this->options).es != false) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Component decoration is not supported in ES targets.");
LAB_00226934:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar2 = (this->options).version;
    uVar1 = uVar2 - 0x8c;
    ts_1 = (uint *)(ulong)uVar1;
    if (uVar1 < 300) {
      ::std::__cxx11::string::string((string *)&local_1a8,"GL_ARB_enhanced_layouts",&local_1a9);
      require_extension_internal(this,&local_1a8);
      ::std::__cxx11::string::~string((string *)&local_1a8);
    }
    else if (uVar2 < 0x8c) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Component decoration is not supported in targets below GLSL 1.40.");
      goto LAB_00226934;
    }
    join<char_const(&)[13],unsigned_int&>
              (&local_1a8,(spirv_cross *)"component = ",(char (*) [13])&pDVar3[uVar6].component,ts_1
              );
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
  }
  bVar4 = Compiler::has_extended_decoration
                    (&this->super_Compiler,__k->id,SPIRVCrossDecorationExplicitOffset);
  if ((bVar4) && ((pDVar3[uVar6].decoration_flags.lower & 0x800000000) != 0)) {
    join<char_const(&)[10],unsigned_int&>
              (&local_1a8,(spirv_cross *)0x2c7337,(char (*) [10])&pDVar3[uVar6].offset,ts_1);
  }
  else {
    if ((type->storage != StorageClassOutput) ||
       ((pDVar3[uVar6].decoration_flags.lower & 0x800000000) == 0)) goto LAB_00226877;
    join<char_const(&)[14],unsigned_int&>
              (&local_1a8,(spirv_cross *)0x2c7333,(char (*) [14])&pDVar3[uVar6].offset,ts_1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(&attr,&local_1a8);
  ::std::__cxx11::string::~string((string *)&local_1a8);
LAB_00226877:
  if (attr.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_1a8);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"layout(",(allocator *)&local_1a8);
    merge(&local_1a8,&attr,", ");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&attr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	if (is_legacy())
		return "";

	bool is_block = has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);
	if (!is_block)
		return "";

	auto &memb = ir.meta[type.self].members;
	if (index >= memb.size())
		return "";
	auto &dec = memb[index];

	SmallVector<string> attr;

	if (has_member_decoration(type.self, index, DecorationPassthroughNV))
		attr.push_back("passthrough");

	// We can only apply layouts on members in block interfaces.
	// This is a bit problematic because in SPIR-V decorations are applied on the struct types directly.
	// This is not supported on GLSL, so we have to make the assumption that if a struct within our buffer block struct
	// has a decoration, it was originally caused by a top-level layout() qualifier in GLSL.
	//
	// We would like to go from (SPIR-V style):
	//
	// struct Foo { layout(row_major) mat4 matrix; };
	// buffer UBO { Foo foo; };
	//
	// to
	//
	// struct Foo { mat4 matrix; }; // GLSL doesn't support any layout shenanigans in raw struct declarations.
	// buffer UBO { layout(row_major) Foo foo; }; // Apply the layout on top-level.
	auto flags = combined_decoration_for_member(type, index);

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	// We don't emit any global layouts, so column_major is default.
	//if (flags & (1ull << DecorationColMajor))
	//    attr.push_back("column_major");

	if (dec.decoration_flags.get(DecorationLocation) && can_use_io_location(type.storage, true))
		attr.push_back(join("location = ", dec.location));

	// Can only declare component if we can declare location.
	if (dec.decoration_flags.get(DecorationComponent) && can_use_io_location(type.storage, true))
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
			attr.push_back(join("component = ", dec.component));
		}
		else
			SPIRV_CROSS_THROW("Component decoration is not supported in ES targets.");
	}

	// SPIRVCrossDecorationPacked is set by layout_for_variable earlier to mark that we need to emit offset qualifiers.
	// This is only done selectively in GLSL as needed.
	if (has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) &&
	    dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("offset = ", dec.offset));
	else if (type.storage == StorageClassOutput && dec.decoration_flags.get(DecorationOffset))
		attr.push_back(join("xfb_offset = ", dec.offset));

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}